

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_save.c
# Opt level: O2

void save_objects(FILE *fp,AREA_DATA_conflict *pArea)

{
  OBJ_INDEX_DATA *pObjIndex;
  int vnum;
  
  fwrite("#OBJS\n",6,1,(FILE *)fp);
  for (vnum = (int)pArea->min_vnum; vnum <= pArea->max_vnum; vnum = vnum + 1) {
    pObjIndex = get_obj_index(vnum);
    if (pObjIndex != (OBJ_INDEX_DATA *)0x0) {
      save_object(fp,pObjIndex);
    }
  }
  fwrite("#0\n\n\n\n",6,1,(FILE *)fp);
  return;
}

Assistant:

void save_objects(FILE *fp, AREA_DATA *pArea)
{
	OBJ_INDEX_DATA *pObj;

	fprintf(fp, "#OBJS\n");

	for (int i = pArea->min_vnum; i <= pArea->max_vnum; i++)
	{
		if ((pObj = get_obj_index(i)))
			save_object(fp, pObj);
	}

	fprintf(fp, "#0\n\n\n\n");
}